

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O0

CaseDefinition *
vkt::tessellation::anon_unknown_2::makeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,TessPrimitiveType primitiveType,
          SpacingMode spacingMode,string *referenceImagePathPrefix)

{
  string *referenceImagePathPrefix_local;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  CaseDefinition *caseDef;
  
  CaseDefinition::CaseDefinition(__return_storage_ptr__);
  __return_storage_ptr__->primitiveType = primitiveType;
  __return_storage_ptr__->spacingMode = spacingMode;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->referenceImagePathPrefix,
             (string *)referenceImagePathPrefix);
  return __return_storage_ptr__;
}

Assistant:

inline CaseDefinition makeCaseDefinition (const TessPrimitiveType	primitiveType,
										  const SpacingMode			spacingMode,
										  const std::string&		referenceImagePathPrefix)
{
	CaseDefinition caseDef;
	caseDef.primitiveType = primitiveType;
	caseDef.spacingMode = spacingMode;
	caseDef.referenceImagePathPrefix = referenceImagePathPrefix;
	return caseDef;
}